

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_list * mg_list_make_empty(uint32_t capacity)

{
  mg_list *pmVar1;
  
  pmVar1 = (mg_list *)mg_allocator_malloc(&mg_system_allocator,(ulong)capacity * 8 + 0x10);
  if (pmVar1 != (mg_list *)0x0) {
    pmVar1->elements = (mg_value **)(pmVar1 + 1);
    pmVar1->size = 0;
    pmVar1->capacity = capacity;
  }
  return pmVar1;
}

Assistant:

mg_list *mg_list_make_empty(uint32_t capacity) {
  mg_list *list = mg_list_alloc(capacity, &mg_system_allocator);
  if (!list) {
    return NULL;
  }
  list->size = 0;
  list->capacity = capacity;
  return list;
}